

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O3

_Bool ecdsa_verify(ssh_key *key,ptrlen sig,ptrlen data)

{
  ecsign_extra *extra;
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  mp_int *pmVar7;
  mp_int *pmVar8;
  mp_int *y;
  mp_int *n;
  mp_int *n_00;
  WeierstrassPoint *P;
  WeierstrassPoint *Q;
  WeierstrassPoint *wp;
  ptrlen pVar9;
  BinarySource src [1];
  mp_int *x;
  BinarySource local_78;
  mp_int *local_48;
  mp_int *local_40;
  mp_int *local_38;
  
  local_78.len = sig.len;
  local_78.data = sig.ptr;
  extra = (ecsign_extra *)key->vt->extra;
  local_78.pos = 0;
  local_78.err = BSE_NO_ERROR;
  local_78.binarysource_ = &local_78;
  pVar9 = BinarySource_get_string(&local_78);
  _Var1 = ptrlen_eq_string(pVar9,key->vt->ssh_id);
  if (_Var1) {
    pVar9 = BinarySource_get_string(local_78.binarysource_);
    local_78.len = pVar9.len;
    local_78.data = pVar9.ptr;
    if ((local_78.binarysource_)->err == BSE_NO_ERROR) {
      local_78.pos = 0;
      local_78.err = BSE_NO_ERROR;
      local_78.binarysource_ = &local_78;
      pmVar7 = BinarySource_get_mp_ssh2(&local_78);
      pmVar8 = BinarySource_get_mp_ssh2(local_78.binarysource_);
      if ((local_78.binarysource_)->err == BSE_NO_ERROR) {
        uVar2 = mp_eq_integer(pmVar7,0);
        local_40 = pmVar7;
        uVar3 = mp_eq_integer(pmVar8,0);
        local_48 = pmVar8;
        uVar4 = mp_cmp_hs(pmVar7,(mp_int *)(key[-3].vt)->private_blob);
        pmVar7 = local_48;
        uVar5 = mp_cmp_hs(local_48,(mp_int *)(key[-3].vt)->private_blob);
        pmVar8 = ecdsa_signing_exponent_from_data((ec_curve *)key[-3].vt,extra,data);
        y = mp_invert(pmVar7,(mp_int *)(key[-3].vt)->private_blob);
        n = mp_modmul(pmVar8,y,(mp_int *)(key[-3].vt)->private_blob);
        mp_free(pmVar8);
        pmVar8 = local_40;
        n_00 = mp_modmul(local_40,y,(mp_int *)(key[-3].vt)->private_blob);
        mp_free(y);
        P = ecc_weierstrass_multiply((WeierstrassPoint *)(key[-3].vt)->public_blob,n);
        mp_free(n);
        Q = ecc_weierstrass_multiply((WeierstrassPoint *)key[-2].vt,n_00);
        mp_free(n_00);
        wp = ecc_weierstrass_add_general(P,Q);
        ecc_weierstrass_point_free(P);
        ecc_weierstrass_point_free(Q);
        ecc_weierstrass_get_affine(wp,&local_38,(mp_int **)0x0);
        ecc_weierstrass_point_free(wp);
        mp_divmod_into(local_38,(mp_int *)(key[-3].vt)->private_blob,(mp_int *)0x0,local_38);
        uVar6 = mp_cmp_eq(pmVar8,local_38);
        mp_free(local_38);
        mp_free(pmVar8);
        mp_free(pmVar7);
        return uVar6 == 1 && (uVar5 == 0 && (uVar4 == 0 && (uVar3 == 0 && uVar2 == 0)));
      }
      mp_free(pmVar7);
      mp_free(pmVar8);
    }
  }
  return false;
}

Assistant:

static bool ecdsa_verify(ssh_key *key, ptrlen sig, ptrlen data)
{
    struct ecdsa_key *ek = container_of(key, struct ecdsa_key, sshk);
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)ek->sshk.vt->extra;

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, sig);

    /* Check the signature starts with the algorithm name */
    if (!ptrlen_eq_string(get_string(src), ek->sshk.vt->ssh_id))
        return false;

    /* Everything else is nested inside a sub-string. Descend into that. */
    ptrlen sigstr = get_string(src);
    if (get_err(src))
        return false;
    BinarySource_BARE_INIT_PL(src, sigstr);

    /* Extract the signature integers r,s */
    mp_int *r = get_mp_ssh2(src);
    mp_int *s = get_mp_ssh2(src);
    if (get_err(src)) {
        mp_free(r);
        mp_free(s);
        return false;
    }

    /* Basic sanity checks: 0 < r,s < order(G) */
    unsigned invalid = 0;
    invalid |= mp_eq_integer(r, 0);
    invalid |= mp_eq_integer(s, 0);
    invalid |= mp_cmp_hs(r, ek->curve->w.G_order);
    invalid |= mp_cmp_hs(s, ek->curve->w.G_order);

    /* Get the hash of the signed data, converted to an integer */
    mp_int *z = ecdsa_signing_exponent_from_data(ek->curve, extra, data);

    /* Verify the signature integers against the hash */
    mp_int *w = mp_invert(s, ek->curve->w.G_order);
    mp_int *u1 = mp_modmul(z, w, ek->curve->w.G_order);
    mp_free(z);
    mp_int *u2 = mp_modmul(r, w, ek->curve->w.G_order);
    mp_free(w);
    WeierstrassPoint *u1G = ecc_weierstrass_multiply(ek->curve->w.G, u1);
    mp_free(u1);
    WeierstrassPoint *u2P = ecc_weierstrass_multiply(ek->publicKey, u2);
    mp_free(u2);
    WeierstrassPoint *sum = ecc_weierstrass_add_general(u1G, u2P);
    ecc_weierstrass_point_free(u1G);
    ecc_weierstrass_point_free(u2P);

    mp_int *x;
    ecc_weierstrass_get_affine(sum, &x, NULL);
    ecc_weierstrass_point_free(sum);

    mp_divmod_into(x, ek->curve->w.G_order, NULL, x);
    invalid |= (1 ^ mp_cmp_eq(r, x));
    mp_free(x);

    mp_free(r);
    mp_free(s);

    return !invalid;
}